

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_interior_seg_normal(REF_GRID ref_grid,REF_INT cell,REF_DBL *normal)

{
  REF_CELL ref_cell;
  int iVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dot;
  REF_DBL tri_side [3];
  REF_INT t;
  REF_INT other;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_NODE ref_node;
  REF_CELL tri;
  REF_CELL edg;
  REF_INT nodes [27];
  REF_DBL *normal_local;
  REF_INT cell_local;
  REF_GRID ref_grid_local;
  
  ref_cell = ref_grid->cell[3];
  unique0x00012000 = ref_grid->node;
  unique0x10000369 = normal;
  ref_grid_local._4_4_ = ref_cell_nodes(ref_grid->cell[0],cell,(REF_INT *)&edg);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_node_seg_normal(stack0xffffffffffffff50,(REF_INT *)&edg,stack0xffffffffffffffd8);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_math_normalize(stack0xffffffffffffffd8);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_cell_list_with2(ref_cell,(REF_INT)edg,edg._4_4_,2,tri_list,&t);
        if (ref_grid_local._4_4_ == 0) {
          if ((long)tri_list[0] == 1) {
            iVar1 = ((ref_cell->c2n[ref_cell->size_per * t] +
                      ref_cell->c2n[ref_cell->size_per * t + 1] +
                     ref_cell->c2n[ref_cell->size_per * t + 2]) - (REF_INT)edg) - edg._4_4_;
            dot = stack0xffffffffffffff50->real[iVar1 * 0xf] -
                  stack0xffffffffffffff50->real[(REF_INT)edg * 0xf];
            tri_side[0] = stack0xffffffffffffff50->real[iVar1 * 0xf + 1] -
                          stack0xffffffffffffff50->real[(REF_INT)edg * 0xf + 1];
            tri_side[1] = stack0xffffffffffffff50->real[iVar1 * 0xf + 2] -
                          stack0xffffffffffffff50->real[(REF_INT)edg * 0xf + 2];
            ref_grid_local._4_4_ = ref_math_normalize(&dot);
            if (ref_grid_local._4_4_ == 0) {
              if (stack0xffffffffffffffd8[2] * tri_side[1] +
                  *stack0xffffffffffffffd8 * dot + stack0xffffffffffffffd8[1] * tri_side[0] < 0.0) {
                *stack0xffffffffffffffd8 = -*stack0xffffffffffffffd8;
                stack0xffffffffffffffd8[1] = -stack0xffffffffffffffd8[1];
                stack0xffffffffffffffd8[2] = -stack0xffffffffffffffd8[2];
              }
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x1fc,"ref_layer_interior_seg_normal",(ulong)ref_grid_local._4_4_,"norm");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x1f2,"ref_layer_interior_seg_normal","expected one tri at bounary",1,
                   (long)tri_list[0]);
            ref_grid_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x1f1,"ref_layer_interior_seg_normal",(ulong)ref_grid_local._4_4_,"tri with2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x1ef,"ref_layer_interior_seg_normal",(ulong)ref_grid_local._4_4_,"norm");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x1ee
             ,"ref_layer_interior_seg_normal",(ulong)ref_grid_local._4_4_,"normal");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x1ed,
           "ref_layer_interior_seg_normal",(ulong)ref_grid_local._4_4_,"cell");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_layer_interior_seg_normal(REF_GRID ref_grid,
                                                 REF_INT cell,
                                                 REF_DBL *normal) {
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ntri, tri_list[2], other, t;
  REF_DBL tri_side[3];
  REF_DBL dot;
  RSS(ref_cell_nodes(edg, cell, nodes), "cell");
  RSS(ref_node_seg_normal(ref_node, nodes, normal), "normal");
  RSS(ref_math_normalize(normal), "norm");
  RSS(ref_cell_list_with2(tri, nodes[0], nodes[1], 2, &ntri, tri_list),
      "tri with2");
  REIS(1, ntri, "expected one tri at bounary");
  t = tri_list[0];
  other = ref_cell_c2n(tri, 0, t) + ref_cell_c2n(tri, 1, t) +
          ref_cell_c2n(tri, 2, t) - nodes[0] - nodes[1];
  tri_side[0] =
      ref_node_xyz(ref_node, 0, other) - ref_node_xyz(ref_node, 0, nodes[0]);
  tri_side[1] =
      ref_node_xyz(ref_node, 1, other) - ref_node_xyz(ref_node, 1, nodes[0]);
  tri_side[2] =
      ref_node_xyz(ref_node, 2, other) - ref_node_xyz(ref_node, 2, nodes[0]);
  RSS(ref_math_normalize(tri_side), "norm");
  dot = ref_math_dot(normal, tri_side);
  if (dot < 0) {
    normal[0] = -normal[0];
    normal[1] = -normal[1];
    normal[2] = -normal[2];
  }
  return REF_SUCCESS;
}